

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::emitCurrentIndexChanged(QComboBoxPrivate *this,QModelIndex *index)

{
  QModelIndex *index_00;
  QComboBoxPrivate *in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBox *q;
  QString text;
  QAccessibleValueChangeEvent event;
  QString *in_stack_ffffffffffffff38;
  QComboBoxPrivate *in_stack_ffffffffffffff40;
  QVariant *this_00;
  QObject *obj;
  QAccessibleValueChangeEvent *this_01;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  QVariant local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  index_00 = (QModelIndex *)q_func(in_RDI);
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  itemText(in_RSI,index_00);
  QModelIndex::row((QModelIndex *)in_RSI);
  QComboBox::currentIndexChanged
            ((QComboBox *)0x5362a2,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  if (in_RDI->lineEdit == (QLineEdit *)0x0) {
    updateCurrentText(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_68;
  this_01 = (QAccessibleValueChangeEvent *)&local_80;
  ::QVariant::QVariant(this_00,(QString *)this_01);
  obj = (QObject *)&local_48;
  QAccessibleValueChangeEvent::QAccessibleValueChangeEvent(this_01,obj,this_00);
  ::QVariant::~QVariant(this_00);
  QAccessible::updateAccessibility((QAccessibleEvent *)obj);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent((QAccessibleValueChangeEvent *)obj);
  QString::~QString((QString *)0x53634c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::emitCurrentIndexChanged(const QModelIndex &index)
{
    Q_Q(QComboBox);
    const QString text = itemText(index);
    emit q->currentIndexChanged(index.row());
    // signal lineEdit.textChanged already connected to signal currentTextChanged, so don't emit double here
    if (!lineEdit)
        updateCurrentText(text);
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(q, text);
    QAccessible::updateAccessibility(&event);
#endif
}